

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_message.cc
# Opt level: O1

void printISOTime(char *buffer,size_t buffer_len)

{
  tm *__tp;
  size_t sVar1;
  char tz_offset_str [6];
  time_t rawtime;
  timeval cur_time;
  char local_3e [3];
  char local_3b [3];
  time_t local_38;
  timeval local_30;
  
  time(&local_38);
  __tp = localtime(&local_38);
  sVar1 = strftime(buffer,buffer_len,"%Y-%m-%dT%H:%M:%S",__tp);
  gettimeofday(&local_30,(__timezone_ptr_t)0x0);
  sprintf(buffer + sVar1,".%03d",
          (ulong)(uint)((int)(SUB168(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_30.tv_usec),8) >> 7
                             ) - (SUB164(SEXT816(0x20c49ba5e353f7cf) * SEXT816(local_30.tv_usec),0xc
                                        ) >> 0x1f)));
  sVar1 = strftime(local_3e,6,"%z",__tp);
  if (4 < sVar1) {
    strncat(buffer,local_3e,3);
    sVar1 = strlen(buffer);
    (buffer + sVar1)[0] = ':';
    (buffer + sVar1)[1] = '\0';
    strncat(buffer,local_3b,2);
  }
  return;
}

Assistant:

void printISOTime(char* buffer, size_t buffer_len) {
    struct tm* tm_now;
    time_t rawtime;
    time(&rawtime);
    tm_now = localtime(&rawtime);

    // 2017-06-22T10:00:00
    size_t time_len = strftime(buffer, buffer_len,
                               "%Y-%m-%dT%H:%M:%S", tm_now);

    // Add milliseconds
    timeval cur_time;
    gettimeofday(&cur_time, NULL);
    size_t milli = cur_time.tv_usec / 1000;
    // 2017-06-22T10:00:00.123
    sprintf(buffer + time_len, ".%03d", (int)milli);
    time_len += 4;

    // timezone offset format: -0500
    char tz_offset_str[6];
    size_t offset_len =  strftime(tz_offset_str, 6,
                                  "%z", tm_now);
    if (offset_len < 5) {
        // Time zone info is not supported, skip it.
        return;
    }

    // hour
    strncat(buffer, tz_offset_str, 3);
    // :
    strcat(buffer, ":");
    // min
    strncat(buffer, tz_offset_str + 3, 2);
    // final format: 2017-06-22T10:00:00.123-05:00
}